

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O1

void __thiscall
QCborContainerPrivate::replaceAt
          (QCborContainerPrivate *this,qsizetype idx,QCborValue *value,ContainerDisposition disp)

{
  Element *e;
  pointer pEVar1;
  char *pcVar2;
  
  pEVar1 = QList<QtCbor::Element>::data(&this->elements);
  e = pEVar1 + idx;
  if ((pEVar1[idx].flags.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
       super_QFlagsStorage<QtCbor::Element::ValueFlag>.i & 1) == 0) {
    if (((e->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
         super_QFlagsStorage<QtCbor::Element::ValueFlag>.i & 2) != 0) {
      pcVar2 = (this->data).d.ptr;
      if (pcVar2 == (char *)0x0) {
        pcVar2 = "";
      }
      this->usedData = (this->usedData - *(long *)(pcVar2 + (e->field_0).value)) + -8;
    }
  }
  else {
    deref((e->field_0).container);
    (e->field_0).value = 0;
    (e->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
    super_QFlagsStorage<QtCbor::Element::ValueFlag>.i = 0;
  }
  replaceAt_internal(this,e,value,disp);
  return;
}

Assistant:

void replaceAt(qsizetype idx, const QCborValue &value, ContainerDisposition disp = CopyContainer)
    {
        QtCbor::Element &e = elements[idx];
        if (e.flags & QtCbor::Element::IsContainer) {
            e.container->deref();
            e.container = nullptr;
            e.flags = {};
        } else if (auto b = byteData(e)) {
            usedData -= b->len + sizeof(QtCbor::ByteData);
        }
        replaceAt_internal(e, value, disp);
    }